

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmType GetVmType(ExpressionContext *ctx,TypeBase *type)

{
  VmType VVar1;
  VmType VVar2;
  undefined8 uVar3;
  ulong uVar4;
  VmType VVar5;
  
  if (ctx->typeVoid == type) {
    uVar4 = 0;
    goto LAB_001ababb;
  }
  if ((((ctx->typeBool == type) || (ctx->typeChar == type)) || (ctx->typeShort == type)) ||
     (ctx->typeInt == type)) goto LAB_001abb76;
  if (ctx->typeLong == type) {
    return (VmType)ZEXT816(0x800000003);
  }
  if (ctx->typeFloat == type) {
    return (VmType)ZEXT816(0x800000002);
  }
  if (ctx->typeDouble == type) {
    return (VmType)ZEXT816(0x800000002);
  }
  if (type != (TypeBase *)0x0) {
    if (type->typeID == 0x12) {
LAB_001aba8b:
      VVar5.structType = type;
      VVar5.type = VM_TYPE_POINTER;
      VVar5.size = 8;
      if (type != (TypeBase *)0x0) {
        return VVar5;
      }
      __assert_fail("structType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.h"
                    ,0xcd,"static const VmType VmType::Pointer(TypeBase *)");
    }
    if (type != (TypeBase *)0x0) {
      if (type->typeID == 0x15) {
        if (type == (TypeBase *)0x0) {
          __assert_fail("structType",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.h"
                        ,0xd4,"static const VmType VmType::FunctionRef(TypeBase *)");
        }
        uVar3 = 0xc00000007;
LAB_001abb19:
        VVar1.structType = type;
        VVar1.type = (int)uVar3;
        VVar1.size = (int)((ulong)uVar3 >> 0x20);
        return VVar1;
      }
      if (type != (TypeBase *)0x0) {
        if (type->typeID == 0x14) {
          if (type == (TypeBase *)0x0) {
            __assert_fail("structType",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.h"
                          ,0xdb,"static const VmType VmType::ArrayRef(TypeBase *)");
          }
          uVar3 = 0xc00000008;
          goto LAB_001abb19;
        }
        if (type != (TypeBase *)0x0) {
          if (type->typeID == 0x10) {
            uVar4 = 0xc00000009;
LAB_001ababb:
            VVar2.structType = (TypeBase *)0x0;
            VVar2.type = (int)uVar4;
            VVar2.size = (int)(uVar4 >> 0x20);
            return VVar2;
          }
          if (type != (TypeBase *)0x0) {
            if (type->typeID == 0x11) {
              uVar4 = 0x100000000a;
              goto LAB_001ababb;
            }
            if (type != (TypeBase *)0x0) {
              if (type->typeID == 9) {
LAB_001abb76:
                return (VmType)ZEXT816(0x400000001);
              }
              if (type != (TypeBase *)0x0) {
                if (type->typeID == 10) goto LAB_001abb76;
                if (type != (TypeBase *)0x0) {
                  if (type->typeID == 0xb) goto LAB_001aba8b;
                  if (type != (TypeBase *)0x0) {
                    if (type->typeID == 0x13) {
LAB_001abba0:
                      uVar4 = type->size;
                      if ((uVar4 & 3) != 0) {
                        __assert_fail("type->size % 4 == 0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                                      ,0x9a9,"VmType GetVmType(ExpressionContext &, TypeBase *)");
                      }
                      if ((long)uVar4 < 0x10000000) {
                        VVar5 = VmType::Struct(uVar4,type);
                        return VVar5;
                      }
                      __assert_fail("type->size < NULLC_MAX_TYPE_SIZE",
                                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                                    ,0x9aa,"VmType GetVmType(ExpressionContext &, TypeBase *)");
                    }
                    if (type != (TypeBase *)0x0) {
                      if (type->typeID == 0x18) goto LAB_001abba0;
                      if ((type != (TypeBase *)0x0) && (type->typeID == 0x19)) goto LAB_001abb76;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("!\"unknown type\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0x9b2,"VmType GetVmType(ExpressionContext &, TypeBase *)");
}

Assistant:

VmType GetVmType(ExpressionContext &ctx, TypeBase *type)
{
	if(type == ctx.typeVoid)
		return VmType::Void;

	if(type == ctx.typeBool || type == ctx.typeChar || type == ctx.typeShort || type == ctx.typeInt)
		return VmType::Int;

	if(type == ctx.typeLong)
		return VmType::Long;

	if(type == ctx.typeFloat || type == ctx.typeDouble)
		return VmType::Double;

	if(isType<TypeRef>(type))
		return VmType::Pointer(type);

	if(isType<TypeFunction>(type))
		return VmType::FunctionRef(type);

	if(isType<TypeUnsizedArray>(type))
		return VmType::ArrayRef(type);

	if(isType<TypeAutoRef>(type))
		return VmType::AutoRef;

	if(isType<TypeAutoArray>(type))
		return VmType::AutoArray;

	if(isType<TypeTypeID>(type))
		return VmType::Int;

	if(isType<TypeFunctionID>(type))
		return VmType::Int;

	if(isType<TypeNullptr>(type))
		return VmType::Pointer(type);

	if(isType<TypeArray>(type) || isType<TypeClass>(type))
	{
		assert(type->size % 4 == 0);
		assert(type->size < NULLC_MAX_TYPE_SIZE);

		return VmType::Struct(type->size, type);
	}

	if(isType<TypeEnum>(type))
		return VmType::Int;

	assert(!"unknown type");

	return VmType::Void;
}